

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_run_mode.h
# Opt level: O0

int32_t __thiscall charls::context_run_mode::get_golomb_code(context_run_mode *this)

{
  int local_1c;
  uint local_18;
  int32_t k;
  int32_t n_test;
  int32_t temp;
  context_run_mode *this_local;
  
  local_18 = (uint)this->n_;
  local_1c = 0;
  while( true ) {
    if (this->a_ + ((int)(uint)this->n_ >> 1) * this->run_interruption_type_ <= (int)local_18) {
      return local_1c;
    }
    local_18 = local_18 << 1;
    if (0x20 < local_1c) break;
    local_1c = local_1c + 1;
  }
  __assert_fail("k <= 32",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/context_run_mode.h"
                ,0x2a,"int32_t charls::context_run_mode::get_golomb_code() const");
}

Assistant:

FORCE_INLINE int32_t get_golomb_code() const noexcept
    {
        const int32_t temp{a_ + (n_ >> 1) * run_interruption_type_};
        int32_t n_test{n_};
        int32_t k{};
        for (; n_test < temp; ++k)
        {
            n_test <<= 1;
            ASSERT(k <= 32);
        }
        return k;
    }